

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O0

void Gia_ManCheckIntegrityWithBoxes(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj_00;
  Vec_Int_t *p_00;
  bool bVar3;
  uint local_2c;
  uint local_28;
  int nCountCarry;
  int nCountReg;
  int i;
  Vec_Int_t *vCarryOuts;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  local_28 = 0;
  local_2c = 0;
  if (p->pManTime != (void *)0x0) {
    Gia_ManCreateRefs(p);
    iVar1 = Gia_ManPoNum(p);
    iVar2 = Gia_ManRegBoxNum(p);
    for (nCountCarry = iVar1 - iVar2; iVar1 = Gia_ManPoNum(p), nCountCarry < iVar1;
        nCountCarry = nCountCarry + 1) {
      pObj_00 = Gia_ManPo(p,nCountCarry);
      vCarryOuts = (Vec_Int_t *)Gia_ObjFanin0(pObj_00);
      iVar1 = Gia_ObjIsCi((Gia_Obj_t *)vCarryOuts);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsCi(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                      ,0x1ac,"void Gia_ManCheckIntegrityWithBoxes(Gia_Man_t *)");
      }
      iVar1 = Gia_ObjRefNum(p,(Gia_Obj_t *)vCarryOuts);
      if (1 < iVar1) {
        local_28 = local_28 + 1;
      }
    }
    p_00 = Gia_ManComputeCarryOuts(p);
    nCountCarry = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p_00);
      bVar3 = false;
      if (nCountCarry < iVar1) {
        iVar1 = Vec_IntEntry(p_00,nCountCarry);
        vCarryOuts = (Vec_Int_t *)Gia_ManObj(p,iVar1);
        bVar3 = vCarryOuts != (Vec_Int_t *)0x0;
      }
      if (!bVar3) break;
      iVar1 = Gia_ObjRefNum(p,(Gia_Obj_t *)vCarryOuts);
      if (1 < iVar1) {
        local_2c = local_2c + 1;
      }
      nCountCarry = nCountCarry + 1;
    }
    Vec_IntFree(p_00);
    if ((local_28 != 0) || (local_2c != 0)) {
      printf("Warning: AIG with boxes has internal fanout in %d complex flops and %d carries.\n",
             (ulong)local_28,(ulong)local_2c);
    }
    if (p->pRefs != (int *)0x0) {
      free(p->pRefs);
      p->pRefs = (int *)0x0;
    }
  }
  return;
}

Assistant:

void Gia_ManCheckIntegrityWithBoxes( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vCarryOuts;
    int i, nCountReg = 0, nCountCarry = 0;
    if ( p->pManTime == NULL )
        return;
    Gia_ManCreateRefs( p );
    for ( i = Gia_ManPoNum(p) - Gia_ManRegBoxNum(p); i < Gia_ManPoNum(p); i++ )
    {
        pObj = Gia_ObjFanin0( Gia_ManPo(p, i) );
        assert( Gia_ObjIsCi(pObj) );
        if ( Gia_ObjRefNum(p, pObj) > 1 )
            nCountReg++;
    }
    vCarryOuts = Gia_ManComputeCarryOuts( p );
    Gia_ManForEachObjVec( vCarryOuts, p, pObj, i )
        if ( Gia_ObjRefNum(p, pObj) > 1 )
            nCountCarry++;
    Vec_IntFree( vCarryOuts );
    if ( nCountReg || nCountCarry )
        printf( "Warning: AIG with boxes has internal fanout in %d complex flops and %d carries.\n", nCountReg, nCountCarry );
    ABC_FREE( p->pRefs );
}